

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,string *name,bool quiet,Encoding encoding)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  codecvt *this_00;
  undefined2 local_6c;
  undefined1 local_6a;
  char magic [3];
  locale local_60;
  locale local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Encoding local_20;
  byte local_19;
  Encoding encoding_local;
  bool quiet_local;
  string *name_local;
  cmGeneratedFileStream *this_local;
  
  local_20 = encoding;
  local_19 = quiet;
  _encoding_local = name;
  name_local = (string *)this;
  std::ios::ios((ios *)&(this->super_ofstream).field_0x160);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             _encoding_local);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_017d4150;
  *(undefined ***)&(this->super_ofstream).field_0x160 = &PTR__cmGeneratedFileStream_017d4178;
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(this,(char *)&PTR_construction_vtable_24__017d4190,_Var2);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_017d4150;
  *(undefined ***)&(this->super_ofstream).field_0x160 = &PTR__cmGeneratedFileStream_017d4178;
  bVar1 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((bVar1 & 1) != 0) && ((local_19 & 1) == 0)) {
    std::operator+(&local_50,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x138);
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmSystemTools::ReportLastSystemError("");
  }
  if (local_20 != None) {
    std::ios_base::getloc((ios_base *)&stack0xffffffffffffff98);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,local_20);
    std::locale::locale<codecvt>(&local_60,(locale *)&stack0xffffffffffffff98,this_00);
    std::ios::imbue(&local_58);
    std::locale::~locale(&local_58);
    std::locale::~locale(&local_60);
    std::locale::~locale((locale *)&stack0xffffffffffffff98);
  }
  if (local_20 == UTF8_WITH_BOM) {
    local_6a = 0xbf;
    local_6c = 0xbbef;
    std::ostream::write((char *)this,(long)&local_6c);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(std::string const& name,
                                             bool quiet, Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(this->TempName.c_str()) // NOLINT(cmake-use-cmsys-fstream)
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
#ifndef CMAKE_BOOTSTRAP
  if (encoding != codecvt_Encoding::None) {
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
  if (encoding == codecvt_Encoding::UTF8_WITH_BOM) {
    // Write the BOM encoding header into the file
    char magic[] = { static_cast<char>(0xEF), static_cast<char>(0xBB),
                     static_cast<char>(0xBF) };
    this->write(magic, 3);
  }
}